

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::
TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
::Matches(TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&>>,std::tuple<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&>>
                    (&this->matchers_,args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>_&>
            ::Matches(&(this->extra_matcher_).
                       super_MatcherBase<const_std::tuple<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>_&>
                      ,args);
    return bVar1;
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }